

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  long lVar1;
  stbi__write_context *s_00;
  stbi__write_context *s_01;
  uchar *puVar2;
  uchar uVar3;
  long lVar4;
  uchar uVar5;
  uchar uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uchar uVar10;
  undefined4 in_register_00000034;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uchar scanlineheader [4];
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  char local_81;
  ulong local_80;
  uchar *local_78;
  stbi__write_context *local_70;
  long local_68;
  undefined8 local_60;
  undefined4 local_54;
  long local_50;
  uchar *local_48;
  float local_40;
  float local_3c;
  char local_38 [4];
  char local_34 [4];
  
  local_54 = CONCAT22((ushort)width << 8 | (ushort)width >> 8,0x202);
  local_70 = s;
  if (width - 0x8000U < 0xffff8008) {
    if (0 < width) {
      uVar12 = (ulong)(uint)width;
      do {
        if (ncomp - 3U < 2) {
          fVar15 = scanline[2];
          fVar17 = scanline[1];
          fVar18 = *scanline;
        }
        else {
          fVar15 = *scanline;
          fVar17 = fVar15;
          fVar18 = fVar15;
        }
        fVar14 = fVar17;
        if (fVar17 <= fVar15) {
          fVar14 = fVar15;
        }
        fVar16 = fVar18;
        if (fVar18 <= fVar14) {
          fVar16 = fVar14;
        }
        if (1e-32 <= fVar16) {
          local_60 = CONCAT44(local_60._4_4_,fVar15);
          local_78 = (uchar *)CONCAT44(local_78._4_4_,fVar17);
          local_68 = CONCAT44(local_68._4_4_,fVar18);
          local_80 = CONCAT44(local_80._4_4_,fVar16);
          fVar15 = frexpf(fVar16,(int *)local_38);
          fVar15 = (fVar15 * 256.0) / (float)local_80;
          local_84 = (undefined1)(int)((float)local_68 * fVar15);
          local_83 = (undefined1)(int)(local_78._0_4_ * fVar15);
          local_82 = (undefined1)(int)((float)local_60 * fVar15);
          local_81 = local_38[0] + -0x80;
        }
        else {
          local_83 = 0;
          local_84 = 0;
          local_81 = '\0';
          local_82 = 0;
        }
        (*local_70->func)(local_70->context,&local_84,4);
        scanline = scanline + ncomp;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  else {
    local_78 = (uchar *)CONCAT44(local_78._4_4_,ncomp + -3);
    uVar12 = 0;
    local_80 = (ulong)(uint)width;
    local_60 = CONCAT44(in_register_00000034,width);
    local_48 = scratch;
    do {
      if ((uint)local_78._0_4_ < 2) {
        fVar15 = scanline[2];
        fVar17 = scanline[1];
        fVar18 = *scanline;
      }
      else {
        fVar15 = *scanline;
        fVar17 = fVar15;
        fVar18 = fVar15;
      }
      fVar14 = fVar17;
      if (fVar17 <= fVar15) {
        fVar14 = fVar15;
      }
      fVar16 = fVar18;
      if (fVar18 <= fVar14) {
        fVar16 = fVar14;
      }
      if (1e-32 <= fVar16) {
        local_68 = CONCAT44(local_68._4_4_,fVar15);
        local_50 = CONCAT44(local_50._4_4_,fVar17);
        local_40 = fVar16;
        local_3c = fVar18;
        fVar15 = frexpf(fVar16,(int *)local_34);
        fVar15 = (fVar15 * 256.0) / local_40;
        uVar5 = (uchar)(int)(local_3c * fVar15);
        uVar6 = (uchar)(int)((float)local_50 * fVar15);
        uVar10 = (uchar)(int)((float)local_68 * fVar15);
        uVar3 = local_34[0] + 0x80;
        s = local_70;
      }
      else {
        uVar6 = '\0';
        uVar5 = '\0';
        uVar3 = '\0';
        uVar10 = '\0';
      }
      local_48[uVar12] = uVar5;
      scratch[uVar12 + (uint)width] = uVar6;
      scratch[uVar12 + (uint)(width * 2)] = uVar10;
      scratch[uVar12 + (uint)(width * 3)] = uVar3;
      uVar12 = uVar12 + 1;
      scanline = scanline + ncomp;
    } while (local_80 != uVar12);
    (*s->func)(s->context,&local_54,4);
    local_68 = local_80 - 3;
    local_50 = 0;
    local_78 = local_48;
    do {
      puVar2 = local_48;
      lVar13 = local_50 * local_80;
      iVar11 = 0;
      do {
        s_01 = local_70;
        iVar8 = (int)local_60;
        s_00 = local_70;
        iVar9 = iVar8;
        if (iVar11 + 2 < iVar8) {
          lVar4 = (long)iVar11 + -1;
          uVar3 = puVar2[iVar11 + lVar13];
          iVar7 = iVar11;
          do {
            lVar1 = lVar4 + 2;
            if ((uVar3 == local_78[lVar1]) && (iVar9 = iVar7, uVar3 == local_78[lVar4 + 3])) break;
            iVar7 = iVar7 + 1;
            lVar4 = lVar4 + 1;
            uVar3 = local_78[lVar1];
            iVar9 = iVar8;
          } while (lVar4 < local_68);
        }
        for (; local_70 = s_00, iVar11 < iVar9; iVar11 = iVar11 + iVar8) {
          iVar8 = iVar9 - iVar11;
          if (0x7f < iVar8) {
            iVar8 = 0x80;
          }
          stbiw__write_dump_data(s_01,iVar8,puVar2 + iVar11 + lVar13);
          s_00 = local_70;
        }
        iVar8 = (int)local_60;
        if (iVar9 + 2 < iVar8) {
          lVar4 = (long)iVar9;
          iVar7 = iVar9 + 1;
          if (iVar9 + 1 < iVar8) {
            iVar7 = iVar8;
          }
          do {
            if (local_78[lVar4] != puVar2[iVar11 + lVar13]) {
              iVar7 = (int)lVar4;
              break;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)local_80);
          for (; iVar11 < iVar7; iVar11 = iVar11 + iVar9) {
            iVar9 = iVar7 - iVar11;
            if (0x7e < iVar9) {
              iVar9 = 0x7f;
            }
            stbiw__write_run_data(s_00,iVar9,puVar2[iVar11 + lVar13]);
          }
        }
      } while (iVar11 < (int)local_60);
      local_50 = local_50 + 1;
      local_78 = local_78 + local_80;
    } while (local_50 != 4);
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp,
                               unsigned char *scratch, float *scanline) {
  unsigned char scanlineheader[4] = {2, 2, 0, 0};
  unsigned char rgbe[4];
  float linear[3];
  int x;

  scanlineheader[2] = (width & 0xff00) >> 8;
  scanlineheader[3] = (width & 0x00ff);

  /* skip RLE for images too small or large */
  if (width < 8 || width >= 32768) {
    for (x = 0; x < width; x++) {
      switch (ncomp) {
        case 4: /* fallthrough */
        case 3:
          linear[2] = scanline[x * ncomp + 2];
          linear[1] = scanline[x * ncomp + 1];
          linear[0] = scanline[x * ncomp + 0];
          break;
        default:
          linear[0] = linear[1] = linear[2] = scanline[x * ncomp + 0];
          break;
      }
      stbiw__linear_to_rgbe(rgbe, linear);
      s->func(s->context, rgbe, 4);
    }
  } else {
    int c, r;
    /* encode into scratch buffer */
    for (x = 0; x < width; x++) {
      switch (ncomp) {
        case 4: /* fallthrough */
        case 3:
          linear[2] = scanline[x * ncomp + 2];
          linear[1] = scanline[x * ncomp + 1];
          linear[0] = scanline[x * ncomp + 0];
          break;
        default:
          linear[0] = linear[1] = linear[2] = scanline[x * ncomp + 0];
          break;
      }
      stbiw__linear_to_rgbe(rgbe, linear);
      scratch[x + width * 0] = rgbe[0];
      scratch[x + width * 1] = rgbe[1];
      scratch[x + width * 2] = rgbe[2];
      scratch[x + width * 3] = rgbe[3];
    }

    s->func(s->context, scanlineheader, 4);

    /* RLE each component separately */
    for (c = 0; c < 4; c++) {
      unsigned char *comp = &scratch[width * c];

      x = 0;
      while (x < width) {
        // find first run
        r = x;
        while (r + 2 < width) {
          if (comp[r] == comp[r + 1] && comp[r] == comp[r + 2]) break;
          ++r;
        }
        if (r + 2 >= width) r = width;
        // dump up to first run
        while (x < r) {
          int len = r - x;
          if (len > 128) len = 128;
          stbiw__write_dump_data(s, len, &comp[x]);
          x += len;
        }
        // if there's a run, output it
        if (r + 2 < width) {  // same test as what we break out of in search
                              // loop, so only true if we break'd
          // find next byte after run
          while (r < width && comp[r] == comp[x]) ++r;
          // output run up to r
          while (x < r) {
            int len = r - x;
            if (len > 127) len = 127;
            stbiw__write_run_data(s, len, comp[x]);
            x += len;
          }
        }
      }
    }
  }
}